

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImGuiWindow **ppIVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  bool bVar6;
  short sVar7;
  float fVar8;
  uint uVar9;
  int iVar10;
  ImGuiWindow *pIVar11;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  ImGuiWindow *pIVar14;
  ImGuiViewportP *pIVar15;
  ImGuiWindow *pIVar16;
  byte bVar17;
  char cVar18;
  float fVar19;
  long lVar20;
  char cVar21;
  int iVar22;
  ImGuiWindow *pIVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  pIVar13 = GImGui;
  fVar25 = (GImGui->Style).TouchExtraPadding.x;
  fVar26 = (GImGui->Style).TouchExtraPadding.y;
  if (fVar25 <= 4.0) {
    fVar25 = 4.0;
  }
  if (fVar26 <= 4.0) {
    fVar26 = 4.0;
  }
  IVar12.y = fVar26;
  IVar12.x = fVar25;
  GImGui->WindowsHoverPadding = IVar12;
  pIVar14 = pIVar13->MovingWindow;
  if (pIVar14 == (ImGuiWindow *)0x0) {
    pIVar15 = (ImGuiViewportP *)0x0;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar15 = pIVar14->Viewport;
    pIVar14->Viewport = pIVar13->MouseViewport;
    pIVar23 = (ImGuiWindow *)0x0;
    if ((pIVar14->Flags & 0x200) == 0) {
      pIVar23 = pIVar14;
    }
  }
  fVar25 = (pIVar13->Style).TouchExtraPadding.x;
  bVar24 = (pIVar13->IO).ConfigWindowsResizeFromEdges;
  fVar26 = fVar25;
  if (bVar24 == true) {
    fVar26 = (pIVar13->WindowsHoverPadding).x;
  }
  fVar8 = (pIVar13->Style).TouchExtraPadding.y;
  fVar19 = fVar8;
  if (bVar24 != false) {
    fVar19 = (pIVar13->WindowsHoverPadding).y;
  }
  lVar20 = (long)(pIVar13->Windows).Size;
  if (lVar20 < 1) {
    pIVar16 = (ImGuiWindow *)0x0;
  }
  else {
    lVar20 = lVar20 + 1;
    pIVar16 = (ImGuiWindow *)0x0;
    do {
      pIVar11 = (pIVar13->Windows).Data[lVar20 + -2];
      bVar24 = false;
      if (((pIVar11->Active == true) && (pIVar11->Hidden == false)) &&
         (uVar9 = pIVar11->Flags, (uVar9 >> 9 & 1) == 0)) {
        if (pIVar11->Viewport == (ImGuiViewportP *)0x0) {
          __assert_fail("window->Viewport",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1311,"void FindHoveredWindow()");
        }
        if (pIVar11->Viewport == pIVar13->MouseViewport) {
          fVar27 = fVar25;
          if ((uVar9 & 0x1000042) == 0) {
            fVar27 = fVar26;
          }
          fVar3 = (pIVar13->IO).MousePos.x;
          if ((pIVar11->OuterRectClipped).Min.x - fVar27 <= fVar3) {
            fVar28 = fVar8;
            if ((uVar9 & 0x1000042) == 0) {
              fVar28 = fVar19;
            }
            fVar4 = (pIVar13->IO).MousePos.y;
            if ((((pIVar11->OuterRectClipped).Min.y - fVar28 <= fVar4) &&
                (fVar3 < fVar27 + (pIVar11->OuterRectClipped).Max.x)) &&
               (fVar4 < fVar28 + (pIVar11->OuterRectClipped).Max.y)) {
              sVar7 = (pIVar11->HitTestHoleSize).x;
              if (sVar7 != 0) {
                fVar27 = (float)(int)(pIVar11->HitTestHoleOffset).x + (pIVar11->Pos).x;
                if (fVar27 <= fVar3) {
                  fVar28 = (float)(int)(pIVar11->HitTestHoleOffset).y + (pIVar11->Pos).y;
                  bVar24 = (fVar4 < (float)(int)(pIVar11->HitTestHoleSize).y + fVar28 &&
                           fVar3 < fVar27 + (float)(int)sVar7) && fVar28 <= fVar4;
                }
                else {
                  bVar24 = false;
                }
                if (bVar24) {
                  bVar24 = false;
                  goto LAB_001285dc;
                }
              }
              if (pIVar23 == (ImGuiWindow *)0x0) {
                pIVar23 = pIVar11;
              }
              if (((pIVar16 == (ImGuiWindow *)0x0) &&
                  (pIVar16 = pIVar11, pIVar14 != (ImGuiWindow *)0x0)) &&
                 (pIVar11->RootWindowDockTree == pIVar14->RootWindowDockTree)) {
                pIVar16 = (ImGuiWindow *)0x0;
              }
              bVar24 = pIVar16 != (ImGuiWindow *)0x0 && pIVar23 != (ImGuiWindow *)0x0;
            }
          }
        }
      }
LAB_001285dc:
    } while ((!bVar24) && (lVar20 = lVar20 + -1, 1 < lVar20));
  }
  pIVar13->HoveredWindow = pIVar23;
  pIVar13->HoveredWindowUnderMovingWindow = pIVar16;
  if (pIVar14 != (ImGuiWindow *)0x0) {
    pIVar14->Viewport = pIVar15;
  }
  if ((pIVar23 != pIVar14 && pIVar23 != (ImGuiWindow *)0x0) &&
     (pIVar23->Viewport != pIVar13->MouseViewport)) {
    __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0xfb5,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
  }
  pIVar14 = GetTopMostPopupModal();
  if (pIVar14 == (ImGuiWindow *)0x0 || pIVar23 == (ImGuiWindow *)0x0) {
LAB_00128690:
    bVar24 = false;
  }
  else {
    pIVar16 = pIVar23->RootWindowDockTree;
    pIVar11 = pIVar16->RootWindow->RootWindowPopupTree->RootWindowDockTree;
    if (pIVar11 == pIVar14) goto LAB_00128690;
    if (pIVar16 == (ImGuiWindow *)0x0) {
      bVar24 = true;
    }
    else {
      do {
        bVar24 = pIVar16 == pIVar14;
        if ((bVar24) || (pIVar16 == pIVar11)) goto LAB_0012868a;
        pIVar16 = pIVar16->ParentWindow;
      } while (pIVar16 != (ImGuiWindow *)0x0);
      bVar24 = false;
LAB_0012868a:
      bVar24 = (bool)(bVar24 ^ 1);
    }
  }
  ppIVar1 = &pIVar13->HoveredWindow;
  uVar9 = (pIVar13->IO).ConfigFlags;
  iVar10 = (pIVar13->OpenPopupStack).Size;
  iVar22 = -1;
  lVar20 = 0;
  bVar17 = 0;
  do {
    if ((pIVar13->IO).MouseClicked[lVar20] == true) {
      (pIVar13->IO).MouseDownOwned[lVar20] = pIVar23 != (ImGuiWindow *)0x0 || 0 < iVar10;
      (pIVar13->IO).MouseDownOwnedUnlessPopupClose[lVar20] =
           pIVar23 != (ImGuiWindow *)0x0 || pIVar14 != (ImGuiWindow *)0x0;
    }
    bVar6 = (pIVar13->IO).MouseDown[lVar20];
    if ((bVar6 == true) &&
       ((iVar22 == -1 ||
        (dVar5 = (pIVar13->IO).MouseClickedTime[iVar22],
        pdVar2 = (pIVar13->IO).MouseClickedTime + lVar20, *pdVar2 <= dVar5 && dVar5 != *pdVar2)))) {
      iVar22 = (int)lVar20;
    }
    bVar17 = bVar17 & 1 | bVar6;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 5);
  bVar6 = true;
  if ((uVar9 & 0x10) == 0) {
    bVar6 = bVar24;
  }
  cVar18 = '\x01';
  cVar21 = '\x01';
  if (iVar22 != -1) {
    cVar21 = (pIVar13->IO).MouseDownOwned[iVar22];
    cVar18 = (pIVar13->IO).MouseDownOwnedUnlessPopupClose[iVar22];
  }
  bVar24 = true;
  if ((pIVar13->DragDropActive == true) &&
     (bVar24 = true, (pIVar13->DragDropSourceFlags & 0x10) != 0)) {
    bVar24 = bVar6;
  }
  if (cVar21 != '\0') {
    bVar24 = bVar6;
  }
  if (bVar24) {
    *ppIVar1 = (ImGuiWindow *)0x0;
    pIVar13->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar13->WantCaptureMouseNextFrame == -1) {
    if ((cVar21 == '\0') || ((bVar24 = true, *ppIVar1 == (ImGuiWindow *)0x0 && (bVar17 == 0)))) {
      bVar24 = 0 < iVar10;
    }
    (pIVar13->IO).WantCaptureMouse = bVar24;
    if (cVar18 != '\0') {
      bVar24 = true;
      lVar20 = 0x3b8;
      if ((*ppIVar1 != (ImGuiWindow *)0x0) || (bVar17 != 0)) goto LAB_001287f0;
    }
    bVar24 = pIVar14 != (ImGuiWindow *)0x0;
    lVar20 = 0x3b8;
  }
  else {
    bVar24 = pIVar13->WantCaptureMouseNextFrame != 0;
    (pIVar13->IO).WantCaptureMouseUnlessPopupClose = bVar24;
    lVar20 = 0x390;
  }
LAB_001287f0:
  *(bool *)((long)(pIVar13->IO).KeyMap + lVar20 + -0x3c) = bVar24;
  if (pIVar13->WantCaptureKeyboardNextFrame == -1) {
    bVar24 = pIVar13->ActiveId != 0 || pIVar14 != (ImGuiWindow *)0x0;
  }
  else {
    bVar24 = pIVar13->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar13->IO).WantCaptureKeyboard = bVar24;
  if (((uVar9 & 9) == 1 & (pIVar13->IO).NavActive) == 1) {
    (pIVar13->IO).WantCaptureKeyboard = true;
  }
  (pIVar13->IO).WantTextInput = pIVar13->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowChildOf(g.HoveredWindow->RootWindowDockTree, modal_window, true, true))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}